

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

ScriptWitness * __thiscall
cfd::core::Transaction::AddScriptWitnessStack
          (ScriptWitness *__return_storage_ptr__,Transaction *this,uint32_t tx_in_index,
          ByteData256 *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  ScriptWitness local_50;
  ScriptWitness *local_30;
  ScriptWitness *witness;
  ByteData256 *data_local;
  Transaction *pTStack_18;
  uint32_t tx_in_index_local;
  Transaction *this_local;
  
  witness = (ScriptWitness *)data;
  data_local._4_4_ = tx_in_index;
  pTStack_18 = this;
  this_local = (Transaction *)__return_storage_ptr__;
  ByteData256::GetBytes(&local_68,data);
  AddScriptWitnessStack(&local_50,this,tx_in_index,&local_68);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_68);
  local_30 = &local_50;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,8);
  ScriptWitness::ScriptWitness(__return_storage_ptr__,local_30);
  ScriptWitness::~ScriptWitness(&local_50);
  return __return_storage_ptr__;
}

Assistant:

const ScriptWitness Transaction::AddScriptWitnessStack(
    uint32_t tx_in_index, const ByteData256 &data) {
  const ScriptWitness &witness =
      AddScriptWitnessStack(tx_in_index, data.GetBytes());
  CallbackStateChange(kStateChangeUpdateSignTxIn);
  return witness;
}